

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

Float __thiscall pbrt::Triangle::SolidAngle(Triangle *this,Point3f *p)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  Float FVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Tuple3<pbrt::Vector3,_float> local_48;
  Tuple3<pbrt::Vector3,_float> local_38;
  undefined1 local_28 [16];
  Tuple3<pbrt::Vector3,_float> local_18;
  
  lVar10 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar13 = (long)this->triIndex;
  lVar14 = *(long *)(lVar10 + 8);
  lVar10 = *(long *)(lVar10 + 0x10);
  lVar15 = (long)*(int *)(lVar14 + lVar13 * 0xc);
  lVar16 = (long)*(int *)(lVar14 + 4 + lVar13 * 0xc);
  fVar1 = *(float *)(lVar10 + 8 + lVar16 * 0xc);
  lVar14 = (long)*(int *)(lVar14 + 8 + lVar13 * 0xc);
  fVar2 = *(float *)(lVar10 + 8 + lVar14 * 0xc);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(lVar10 + lVar15 * 0xc);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(lVar10 + lVar16 * 0xc);
  uVar6 = *(ulong *)(lVar10 + lVar14 * 0xc);
  uVar3 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar7 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar27._4_4_ = uVar7;
  auVar27._0_4_ = uVar3;
  auVar27._8_8_ = 0;
  auVar23 = vsubps_avx(auVar23,auVar27);
  fVar11 = *(float *)(lVar10 + 8 + lVar15 * 0xc) - (p->super_Tuple3<pbrt::Point3,_float>).z;
  auVar18._0_4_ = auVar23._0_4_ * auVar23._0_4_;
  auVar18._4_4_ = auVar23._4_4_ * auVar23._4_4_;
  auVar18._8_4_ = auVar23._8_4_ * auVar23._8_4_;
  auVar18._12_4_ = auVar23._12_4_ * auVar23._12_4_;
  auVar18 = vmovshdup_avx(auVar18);
  auVar18 = vfmadd231ss_fma(auVar18,auVar23,auVar23);
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
  if (auVar18._0_4_ < 0.0) {
    local_28 = auVar23;
    local_38.z = sqrtf(auVar18._0_4_);
    auVar23 = local_28;
  }
  else {
    auVar18 = vsqrtss_avx(auVar18,auVar18);
    local_38.z = auVar18._0_4_;
  }
  auVar24._4_4_ = local_38.z;
  auVar24._0_4_ = local_38.z;
  auVar24._8_4_ = local_38.z;
  auVar24._12_4_ = local_38.z;
  auVar18 = vdivps_avx(auVar23,auVar24);
  local_38.z = fVar11 / local_38.z;
  local_38._0_8_ = vmovlps_avx(auVar18);
  uVar4 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar8 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar19._4_4_ = uVar8;
  auVar19._0_4_ = uVar4;
  auVar19._8_8_ = 0;
  auVar23 = vsubps_avx(auVar28,auVar19);
  fVar1 = fVar1 - (p->super_Tuple3<pbrt::Point3,_float>).z;
  auVar20._0_4_ = auVar23._0_4_ * auVar23._0_4_;
  auVar20._4_4_ = auVar23._4_4_ * auVar23._4_4_;
  auVar20._8_4_ = auVar23._8_4_ * auVar23._8_4_;
  auVar20._12_4_ = auVar23._12_4_ * auVar23._12_4_;
  auVar18 = vmovshdup_avx(auVar20);
  auVar18 = vfmadd231ss_fma(auVar18,auVar23,auVar23);
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
  if (auVar18._0_4_ < 0.0) {
    local_48.z = sqrtf(auVar18._0_4_);
  }
  else {
    auVar18 = vsqrtss_avx(auVar18,auVar18);
    local_48.z = auVar18._0_4_;
  }
  auVar25._4_4_ = local_48.z;
  auVar25._0_4_ = local_48.z;
  auVar25._8_4_ = local_48.z;
  auVar25._12_4_ = local_48.z;
  auVar18 = vdivps_avx(auVar23,auVar25);
  local_48.z = fVar1 / local_48.z;
  local_48._0_8_ = vmovlps_avx(auVar18);
  uVar5 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar9 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar21._4_4_ = uVar9;
  auVar21._0_4_ = uVar5;
  auVar21._8_8_ = 0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar6;
  auVar23 = vsubps_avx(auVar12,auVar21);
  fVar2 = fVar2 - (p->super_Tuple3<pbrt::Point3,_float>).z;
  auVar22._0_4_ = auVar23._0_4_ * auVar23._0_4_;
  auVar22._4_4_ = auVar23._4_4_ * auVar23._4_4_;
  auVar22._8_4_ = auVar23._8_4_ * auVar23._8_4_;
  auVar22._12_4_ = auVar23._12_4_ * auVar23._12_4_;
  auVar18 = vmovshdup_avx(auVar22);
  auVar18 = vfmadd231ss_fma(auVar18,auVar23,auVar23);
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
  if (auVar18._0_4_ < 0.0) {
    local_18.z = sqrtf(auVar18._0_4_);
  }
  else {
    auVar18 = vsqrtss_avx(auVar18,auVar18);
    local_18.z = auVar18._0_4_;
  }
  auVar26._4_4_ = local_18.z;
  auVar26._0_4_ = local_18.z;
  auVar26._8_4_ = local_18.z;
  auVar26._12_4_ = local_18.z;
  auVar18 = vdivps_avx(auVar23,auVar26);
  local_18.z = fVar2 / local_18.z;
  local_18._0_8_ = vmovlps_avx(auVar18);
  FVar17 = SphericalTriangleArea((Vector3f *)&local_38,(Vector3f *)&local_48,(Vector3f *)&local_18);
  return FVar17;
}

Assistant:

PBRT_CPU_GPU
    Float SolidAngle(const Point3f &p) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        return SphericalTriangleArea(Normalize(p0 - p), Normalize(p1 - p),
                                     Normalize(p2 - p));
    }